

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel_p.h
# Opt level: O0

QString * QFileSystemModelPrivate::myComputer(void)

{
  QString *in_RDI;
  int in_stack_ffffffffffffffec;
  
  QFileSystemModel::tr((char *)in_RDI,(char *)in_RDI,in_stack_ffffffffffffffec);
  return in_RDI;
}

Assistant:

inline static QString myComputer() {
        // ### TODO We should query the system to find out what the string should be
        // XP == "My Computer",
        // Vista == "Computer",
        // OS X == "Computer" (sometime user generated) "Benjamin's PowerBook G4"
#ifdef Q_OS_WIN
        return QFileSystemModel::tr("My Computer");
#else
        return QFileSystemModel::tr("Computer");
#endif
    }